

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O1

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpCommonStringsToFile
          (GeneralizedSuffixTree *this,string *filename)

{
  uint uVar1;
  ulong uVar2;
  __node_base _Var3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  Node *pNVar8;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
  *local_68;
  FILE *local_60;
  undefined1 local_58 [8];
  string ans;
  
  puts("Finding common substrings...");
  local_58 = (undefined1  [8])0x0;
  std::vector<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::resize
            (&this->previous_suffixes,
             (long)(this->strings).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->strings).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)local_58);
  ProcessLCAQueries(this,this->root);
  CalculateNumLeavesNumLCA(this,this->root);
  local_68 = &this->answers;
  local_58 = (undefined1  [8])0x0;
  ans._M_dataplus._M_p = (pointer)((ulong)ans._M_dataplus._M_p._4_4_ << 0x20);
  std::
  vector<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
  ::resize(local_68,(long)(this->strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->strings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type *)local_58);
  FindAnswers(this,this->root,0);
  puts("Common substrings were found");
  local_60 = fopen((filename->_M_dataplus)._M_p,"w");
  if (local_60 == (FILE *)0x0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    local_58 = (undefined1  [8])&ans._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Can not open file: ","");
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   filename);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  local_58 = (undefined1  [8])&ans._M_string_length;
  ans._M_dataplus._M_p = (pointer)0x0;
  ans._M_string_length._0_1_ = 0;
  uVar7 = (ulong)((long)(this->strings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->strings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar1 = (int)uVar7 - 1;
  if (uVar1 != 0) {
    uVar6 = (ulong)uVar1;
    ans.field_2._12_4_ = 0;
    do {
      uVar2 = (long)(this->strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      printf("\rWriting substrings to file: %.2f %%",
             SUB84((double)(((float)(uVar2 - uVar6) * 100.0) / (float)uVar2),0));
      fprintf(local_60,"%u common substrings: ",uVar7 & 0xffffffff);
      uVar1 = (this->answers).
              super__Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar6].second;
      if ((uint)ans.field_2._12_4_ < uVar1) {
        ans._M_dataplus._M_p = (pointer)0x0;
        ans.field_2._12_4_ = uVar1;
        *(char *)local_58 = '\0';
        for (pNVar8 = (local_68->
                      super__Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar6].first;
            pNVar8->parent != (Node *)0x0; pNVar8 = pNVar8->parent) {
          _Var3._M_nxt = (_Hash_node_base *)((long)&pNVar8->parent->edges + 0x10);
          do {
            _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
            if (_Var3._M_nxt == (_Hash_node_base *)0x0) goto LAB_001054d4;
          } while ((Node *)_Var3._M_nxt[2]._M_nxt != pNVar8);
          std::__cxx11::string::substr
                    ((ulong)local_a8,
                     (ulong)((this->strings).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                            *(uint *)&_Var3._M_nxt[3]._M_nxt));
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_58);
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_78 = *plVar5;
            lStack_70 = plVar4[3];
            local_88 = &local_78;
          }
          else {
            local_78 = *plVar5;
            local_88 = (long *)*plVar4;
          }
          local_80 = plVar4[1];
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_58,(string *)&local_88);
          if (local_88 != &local_78) {
            operator_delete(local_88,local_78 + 1);
          }
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0],local_98[0] + 1);
          }
LAB_001054d4:
        }
      }
      if (ans._M_dataplus._M_p == (pointer)0x0) {
        fwrite("<Empty string>\n",0xf,1,local_60);
      }
      else {
        fprintf(local_60,"%s\n",local_58);
      }
      uVar7 = uVar6 & 0xffffffff;
      uVar6 = uVar6 - 1;
    } while ((int)uVar6 != 0);
  }
  fclose(local_60);
  puts("\rSubstrings were written successfully");
  if (local_58 != (undefined1  [8])&ans._M_string_length) {
    operator_delete((void *)local_58,
                    CONCAT71(ans._M_string_length._1_7_,(undefined1)ans._M_string_length) + 1);
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::DumpCommonStringsToFile (std::string filename)
{
    printf ("Finding common substrings...\n");
    // process lca_queries
    previous_suffixes.resize (strings.size(), nullptr);
    ProcessLCAQueries (root);
    // calculate number of leaves and least common ancestors
    CalculateNumLeavesNumLCA (root);
    // find answers for all numbers of substrings
    answers.resize (strings.size(), std::pair<Node *, uint> (nullptr, 0));
    FindAnswers (root, 0);
    printf ("Common substrings were found\n");
    // write to file
    FILE *file = fopen (filename.c_str(), "w");
    if (!file)
        throw std::string ("Can not open file: ") + filename;
    std::string ans;
    uint cur_max = 0;
    for (uint i = strings.size() - 1; i > 0; --i)
    {
        printf ("\rWriting substrings to file: %.2f %%", (strings.size() - i) * 100.0f / strings.size());
        fprintf (file, "%u common substrings: ", i + 1);
        if (answers[i].second > cur_max)
        {
            cur_max = answers[i].second;
            ans.clear();
            Node *cur_node = answers[i].first;
            while (cur_node->parent)
            {
                for (const auto &edge_pair : cur_node->parent->edges)
                    if (edge_pair.second.node == cur_node)
                    {
                        ans = strings[edge_pair.second.string_number].substr (edge_pair.second.start,
                                edge_pair.second.length) + ans;
                        break;
                    }
                cur_node  = cur_node->parent;
            }
        }
        if (ans.size())
            fprintf (file, "%s\n", ans.c_str());
        else
            fprintf (file, "<Empty string>\n");
    }
    fclose (file);
    printf ("\rSubstrings were written successfully\n");
}